

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O2

bool __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::load
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this,istream *stream)

{
  streampos sVar1;
  
  sVar1 = address_translator::operator[](this->translator,(streampos)ZEXT816(0));
  std::istream::seekg(stream,sVar1._M_off,sVar1._M_state);
  std::istream::read((char *)stream,(long)&this->header);
  return *(long *)(stream + 8) == 0x40;
}

Assistant:

bool load( std::istream& stream ) override
    {
        stream.seekg( ( *translator )[0] );
        stream.read( reinterpret_cast<char*>( &header ), sizeof( header ) );

        return ( stream.gcount() == sizeof( header ) );
    }